

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::checktet4split(tetgenmesh *this,triface *chktet,int *qflag,double *ccent)

{
  tetrahedron ppdVar1;
  double *pdVar2;
  double *pdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  bool bVar8;
  point pdVar9;
  point p2;
  double dVar10;
  double dVar11;
  double local_330;
  double local_320;
  double smrrv;
  double rrv;
  point e2;
  point e1;
  triface checkedge;
  int j;
  int i;
  int indx [4];
  double local_2d0;
  double D;
  double rhs [4];
  double A [4] [4];
  double rd;
  double smlen;
  double volbnd;
  double vol;
  double maxcosd;
  double elen [6];
  double cosd [6];
  double L [4];
  double N [4] [3];
  double vca [3];
  double local_f8;
  double vbc [3];
  double local_d8;
  double vab [3];
  double local_b8;
  double vdc [3];
  double local_98;
  double vdb [3];
  double local_78;
  double vda [3];
  point *ppt;
  point pd;
  point pc;
  point pb;
  point pa;
  double *ccent_local;
  int *qflag_local;
  triface *chktet_local;
  tetgenmesh *this_local;
  
  rd = 0.0;
  if (this->b->convex != 0) {
    dVar10 = elemattribute(this,chktet->tet,this->numelemattrib + -1);
    if ((dVar10 == -1.0) && (!NAN(dVar10))) {
      return 0;
    }
  }
  *qflag = 0;
  ppdVar4 = chktet->tet[7];
  if (ppdVar4 == (tetrahedron)this->dummypoint) {
    this_local._4_4_ = 0;
  }
  else {
    ppdVar5 = chktet->tet[4];
    ppdVar6 = chktet->tet[5];
    ppdVar7 = chktet->tet[6];
    for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3; checkedge._12_4_ = checkedge._12_4_ + 1) {
      pdVar2 = ppdVar5[(int)checkedge._12_4_];
      pdVar3 = ppdVar4[(int)checkedge._12_4_];
      vda[(long)(int)checkedge._12_4_ + -1] = (double)pdVar2 - (double)pdVar3;
      rhs[(long)(int)checkedge._12_4_ + 3] = (double)pdVar2 - (double)pdVar3;
    }
    for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3; checkedge._12_4_ = checkedge._12_4_ + 1) {
      pdVar2 = ppdVar6[(int)checkedge._12_4_];
      pdVar3 = ppdVar4[(int)checkedge._12_4_];
      vdb[(long)(int)checkedge._12_4_ + -1] = (double)pdVar2 - (double)pdVar3;
      A[0][(long)(int)checkedge._12_4_ + 3] = (double)pdVar2 - (double)pdVar3;
    }
    for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3; checkedge._12_4_ = checkedge._12_4_ + 1) {
      pdVar2 = ppdVar7[(int)checkedge._12_4_];
      pdVar3 = ppdVar4[(int)checkedge._12_4_];
      vdc[(long)(int)checkedge._12_4_ + -1] = (double)pdVar2 - (double)pdVar3;
      A[1][(long)(int)checkedge._12_4_ + 3] = (double)pdVar2 - (double)pdVar3;
    }
    for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3; checkedge._12_4_ = checkedge._12_4_ + 1) {
      vab[(long)(int)checkedge._12_4_ + -1] =
           (double)ppdVar6[(int)checkedge._12_4_] - (double)ppdVar5[(int)checkedge._12_4_];
    }
    for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3; checkedge._12_4_ = checkedge._12_4_ + 1) {
      vbc[(long)(int)checkedge._12_4_ + -1] =
           (double)ppdVar7[(int)checkedge._12_4_] - (double)ppdVar6[(int)checkedge._12_4_];
    }
    for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3; checkedge._12_4_ = checkedge._12_4_ + 1) {
      vca[(long)(int)checkedge._12_4_ + -1] =
           (double)ppdVar5[(int)checkedge._12_4_] - (double)ppdVar7[(int)checkedge._12_4_];
    }
    bVar8 = lu_decmp(this,(double (*) [4])(rhs + 3),3,&j,&local_2d0,0);
    if (bVar8) {
      if ((this->b->varvolume != 0) || (this->b->fixedvolume != 0)) {
        dVar10 = ABS(A[(long)j + -1][3] * A[i][0] * A[indx[0]][1]) / 6.0;
        if ((this->b->fixedvolume != 0) &&
           (pdVar2 = &this->b->maxvolume, *pdVar2 <= dVar10 && dVar10 != *pdVar2)) {
          *qflag = 1;
        }
        if ((((*qflag == 0) && (this->b->varvolume != 0)) &&
            (dVar11 = volumebound(this,chktet->tet), 0.0 < dVar11)) && (dVar11 < dVar10)) {
          *qflag = 1;
        }
        if (*qflag == 1) {
          dVar10 = dot(this,&local_78,&local_78);
          D = dVar10 * 0.5;
          dVar10 = dot(this,&local_98,&local_98);
          rhs[0] = dVar10 * 0.5;
          dVar10 = dot(this,&local_b8,&local_b8);
          rhs[1] = dVar10 * 0.5;
          lu_solve(this,(double (*) [4])(rhs + 3),3,&j,&D,0);
          for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3;
              checkedge._12_4_ = checkedge._12_4_ + 1) {
            ccent[(int)checkedge._12_4_] =
                 (double)ppdVar4[(int)checkedge._12_4_] + rhs[(long)(int)checkedge._12_4_ + -1];
          }
          return 1;
        }
      }
      if (this->b->metric != 0) {
        dVar10 = dot(this,&local_78,&local_78);
        D = dVar10 * 0.5;
        dVar10 = dot(this,&local_98,&local_98);
        rhs[0] = dVar10 * 0.5;
        dVar10 = dot(this,&local_b8,&local_b8);
        rhs[1] = dVar10 * 0.5;
        lu_solve(this,(double (*) [4])(rhs + 3),3,&j,&D,0);
        for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3;
            checkedge._12_4_ = checkedge._12_4_ + 1) {
          ccent[(int)checkedge._12_4_] =
               (double)ppdVar4[(int)checkedge._12_4_] + rhs[(long)(int)checkedge._12_4_ + -1];
        }
        dVar10 = dot(this,&D,&D);
        dVar10 = sqrt(dVar10);
        for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 4;
            checkedge._12_4_ = checkedge._12_4_ + 1) {
          if ((0.0 < (double)chktet->tet[(long)(int)checkedge._12_4_ + 4][this->pointmtrindex]) &&
             (ppdVar1 = chktet->tet[(long)(int)checkedge._12_4_ + 4] + this->pointmtrindex,
             (double)*ppdVar1 <= dVar10 && dVar10 != (double)*ppdVar1)) {
            *qflag = 1;
            return 1;
          }
        }
      }
      if ((this->in->tetunsuitable == (TetSizeFunc)0x0) ||
         (bVar8 = (*this->in->tetunsuitable)
                            ((double *)ppdVar5,(double *)ppdVar6,(double *)ppdVar7,(double *)ppdVar4
                             ,(double *)0x0,0.0), !bVar8)) {
        if (this->useinsertradius != 0) {
          triface::triface((triface *)&e1);
          e1 = (point)chktet->tet;
          for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 6;
              checkedge._12_4_ = checkedge._12_4_ + 1) {
            checkedge.tet._0_4_ = edge2ver[(int)checkedge._12_4_];
            pdVar9 = org(this,(triface *)&e1);
            p2 = dest(this,(triface *)&e1);
            dVar10 = distance(this,pdVar9,p2);
            elen[(long)(int)checkedge._12_4_ + -1] = dVar10;
            if (checkedge._12_4_ == 0) {
              rd = maxcosd;
              checkedge.ver = 0;
            }
            else if (elen[(long)(int)checkedge._12_4_ + -1] < rd) {
              rd = elen[(long)(int)checkedge._12_4_ + -1];
              checkedge.ver = checkedge._12_4_;
            }
          }
          checkedge.tet._0_4_ = edge2ver[checkedge.ver];
          pdVar9 = org(this,(triface *)&e1);
          dVar10 = getpointinsradius(this,pdVar9);
          pdVar9 = dest(this,(triface *)&e1);
          dVar11 = getpointinsradius(this,pdVar9);
          local_320 = dVar10;
          if (((0.0 < dVar11) && (local_320 = dVar11, 0.0 < dVar10)) &&
             (local_320 = dVar10, dVar11 < dVar10)) {
            local_320 = dVar11;
          }
          if (0.0 < local_320) {
            if (ABS(local_320 - rd) / rd < this->b->epsilon) {
              local_320 = rd;
            }
            if (rd < local_320) {
              return 0;
            }
          }
        }
        if (0.0 < this->b->minratio) {
          dVar10 = dot(this,&local_78,&local_78);
          D = dVar10 * 0.5;
          dVar10 = dot(this,&local_98,&local_98);
          rhs[0] = dVar10 * 0.5;
          dVar10 = dot(this,&local_b8,&local_b8);
          rhs[1] = dVar10 * 0.5;
          lu_solve(this,(double (*) [4])(rhs + 3),3,&j,&D,0);
          for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3;
              checkedge._12_4_ = checkedge._12_4_ + 1) {
            ccent[(int)checkedge._12_4_] =
                 (double)ppdVar4[(int)checkedge._12_4_] + rhs[(long)(int)checkedge._12_4_ + -1];
          }
          dVar10 = dot(this,&D,&D);
          dVar10 = sqrt(dVar10);
          if (this->useinsertradius == 0) {
            rd = dot(this,&local_78,&local_78);
            elen[0] = dot(this,&local_98,&local_98);
            elen[1] = dot(this,&local_b8,&local_b8);
            elen[2] = dot(this,&local_d8,&local_d8);
            elen[3] = dot(this,&local_f8,&local_f8);
            elen[4] = dot(this,N[3] + 2,N[3] + 2);
            for (checkedge._12_4_ = 1; (int)checkedge._12_4_ < 6;
                checkedge._12_4_ = checkedge._12_4_ + 1) {
              if (elen[(long)(int)checkedge._12_4_ + -1] <= rd &&
                  rd != elen[(long)(int)checkedge._12_4_ + -1]) {
                rd = elen[(long)(int)checkedge._12_4_ + -1];
              }
            }
            rd = sqrt(rd);
          }
          local_2d0 = dVar10 / rd;
          pdVar2 = &this->b->minratio;
          if (*pdVar2 <= local_2d0 && local_2d0 != *pdVar2) {
            return 1;
          }
        }
        if (0.0 < this->b->mindihedral) {
          for (checkedge.ver = 0; checkedge.ver < 3; checkedge.ver = checkedge.ver + 1) {
            for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3;
                checkedge._12_4_ = checkedge._12_4_ + 1) {
              N[(long)checkedge.ver + -1][(long)(int)checkedge._12_4_ + 2] = 0.0;
            }
            N[(long)checkedge.ver + -1][(long)checkedge.ver + 2] = 1.0;
            lu_solve(this,(double (*) [4])(rhs + 3),3,&j,N[(long)checkedge.ver + -1] + 2,0);
          }
          for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3;
              checkedge._12_4_ = checkedge._12_4_ + 1) {
            vca[(long)(int)checkedge._12_4_ + -4] =
                 (-L[(long)(int)checkedge._12_4_ + 3] - vca[(long)(int)checkedge._12_4_ + -10]) -
                 vca[(long)(int)checkedge._12_4_ + -7];
          }
          for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 4;
              checkedge._12_4_ = checkedge._12_4_ + 1) {
            dVar10 = dot(this,N[(long)(int)checkedge._12_4_ + -1] + 2,
                         N[(long)(int)checkedge._12_4_ + -1] + 2);
            dVar10 = sqrt(dVar10);
            cosd[(long)(int)checkedge._12_4_ + 5] = dVar10;
            if ((cosd[(long)(int)checkedge._12_4_ + 5] == 0.0) &&
               (!NAN(cosd[(long)(int)checkedge._12_4_ + 5]))) {
              terminatetetgen(this,2);
            }
            for (checkedge.ver = 0; checkedge.ver < 3; checkedge.ver = checkedge.ver + 1) {
              N[(long)(int)checkedge._12_4_ + -1][(long)checkedge.ver + 2] =
                   N[(long)(int)checkedge._12_4_ + -1][(long)checkedge.ver + 2] /
                   cosd[(long)(int)checkedge._12_4_ + 5];
            }
          }
          dVar10 = dot(this,L + 3,N[0] + 2);
          elen[5] = -dVar10;
          dVar10 = dot(this,L + 3,N[1] + 2);
          cosd[0] = -dVar10;
          dVar10 = dot(this,L + 3,N[2] + 2);
          cosd[1] = -dVar10;
          dVar10 = dot(this,N[0] + 2,N[1] + 2);
          cosd[2] = -dVar10;
          dVar10 = dot(this,N[0] + 2,N[2] + 2);
          cosd[3] = -dVar10;
          dVar10 = dot(this,N[1] + 2,N[2] + 2);
          cosd[4] = -dVar10;
          vol = elen[5];
          for (checkedge._12_4_ = 1; (int)checkedge._12_4_ < 6;
              checkedge._12_4_ = checkedge._12_4_ + 1) {
            if (elen[(long)(int)checkedge._12_4_ + 5] <= vol) {
              local_330 = vol;
            }
            else {
              local_330 = elen[(long)(int)checkedge._12_4_ + 5];
            }
            vol = local_330;
          }
          if (this->cosmindihed <= vol && vol != this->cosmindihed) {
            dVar10 = dot(this,&local_78,&local_78);
            D = dVar10 * 0.5;
            dVar10 = dot(this,&local_98,&local_98);
            rhs[0] = dVar10 * 0.5;
            dVar10 = dot(this,&local_b8,&local_b8);
            rhs[1] = dVar10 * 0.5;
            lu_solve(this,(double (*) [4])(rhs + 3),3,&j,&D,0);
            for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3;
                checkedge._12_4_ = checkedge._12_4_ + 1) {
              ccent[(int)checkedge._12_4_] =
                   (double)ppdVar4[(int)checkedge._12_4_] + rhs[(long)(int)checkedge._12_4_ + -1];
            }
            return 1;
          }
        }
        this_local._4_4_ = 0;
      }
      else {
        dVar10 = dot(this,&local_78,&local_78);
        D = dVar10 * 0.5;
        dVar10 = dot(this,&local_98,&local_98);
        rhs[0] = dVar10 * 0.5;
        dVar10 = dot(this,&local_b8,&local_b8);
        rhs[1] = dVar10 * 0.5;
        lu_solve(this,(double (*) [4])(rhs + 3),3,&j,&D,0);
        for (checkedge._12_4_ = 0; (int)checkedge._12_4_ < 3;
            checkedge._12_4_ = checkedge._12_4_ + 1) {
          ccent[(int)checkedge._12_4_] =
               (double)ppdVar4[(int)checkedge._12_4_] + rhs[(long)(int)checkedge._12_4_ + -1];
        }
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::checktet4split(triface *chktet, int &qflag, REAL *ccent) 
{
  point pa, pb, pc, pd, *ppt;
  REAL vda[3], vdb[3], vdc[3];
  REAL vab[3], vbc[3], vca[3];
  REAL N[4][3], L[4], cosd[6], elen[6];
  REAL maxcosd, vol, volbnd, smlen = 0, rd;
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i, j;

  if (b->convex) { // -c
    // Skip this tet if it lies in the exterior.
    if (elemattribute(chktet->tet, numelemattrib - 1) == -1.0) {
      return 0;
    }
  }

  qflag = 0;

  pd = (point) chktet->tet[7];
  if (pd == dummypoint) {
    return 0; // Do not split a hull tet.
  }

  pa = (point) chktet->tet[4];
  pb = (point) chktet->tet[5];
  pc = (point) chktet->tet[6];

  // Get the edge vectors vda: d->a, vdb: d->b, vdc: d->c.
  // Set the matrix A = [vda, vdb, vdc]^T.
  for (i = 0; i < 3; i++) A[0][i] = vda[i] = pa[i] - pd[i];
  for (i = 0; i < 3; i++) A[1][i] = vdb[i] = pb[i] - pd[i];
  for (i = 0; i < 3; i++) A[2][i] = vdc[i] = pc[i] - pd[i];

  // Get the other edge vectors.
  for (i = 0; i < 3; i++) vab[i] = pb[i] - pa[i];
  for (i = 0; i < 3; i++) vbc[i] = pc[i] - pb[i];
  for (i = 0; i < 3; i++) vca[i] = pa[i] - pc[i];

  if (!lu_decmp(A, 3, indx, &D, 0)) {
    // A degenerated tet (vol = 0).
    // This is possible due to the use of exact arithmetic.  We temporarily
    //   leave this tet. It should be fixed by mesh optimization.
    return 0; 
  }

  // Check volume if '-a#' and '-a' options are used.
  if (b->varvolume || b->fixedvolume) {
    vol = fabs(A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
    if (b->fixedvolume) {
      if (vol > b->maxvolume) {
        qflag = 1;
      }
    } 
    if (!qflag && b->varvolume) {
      volbnd = volumebound(chktet->tet);
      if ((volbnd > 0.0) && (vol > volbnd)) {
        qflag = 1;
      }
    }
    if (qflag == 1) {
      // Calculate the circumcenter of this tet.
      rhs[0] = 0.5 * dot(vda, vda);
      rhs[1] = 0.5 * dot(vdb, vdb);
      rhs[2] = 0.5 * dot(vdc, vdc);
      lu_solve(A, 3, indx, rhs, 0);            
      for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
      return 1;
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Calculate the circumradius of this tet.
    rhs[0] = 0.5 * dot(vda, vda);
    rhs[1] = 0.5 * dot(vdb, vdb);
    rhs[2] = 0.5 * dot(vdc, vdc);
    lu_solve(A, 3, indx, rhs, 0);            
    for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
    rd = sqrt(dot(rhs, rhs));
    // Check if the ccent lies outside one of the prot.balls at vertices.
    ppt = (point *) &(chktet->tet[4]);
    for (i = 0; i < 4; i++) {
      if (ppt[i][pointmtrindex] > 0) {
        if (rd > ppt[i][pointmtrindex]) {
          qflag = 1; // Enforce mesh size.
          return 1;
        }
      }
    }
  }

  if (in->tetunsuitable != NULL) {
    // Execute the user-defined meshing sizing evaluation.
    if ((*(in->tetunsuitable))(pa, pb, pc, pd, NULL, 0)) {
      // Calculate the circumcenter of this tet.
      rhs[0] = 0.5 * dot(vda, vda);
      rhs[1] = 0.5 * dot(vdb, vdb);
      rhs[2] = 0.5 * dot(vdc, vdc);
      lu_solve(A, 3, indx, rhs, 0);            
      for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
      return 1;
    }
  }

  if (useinsertradius) {
    // Do not split this tet if the shortest edge is shorter than the
    //   insertion radius of one of its endpoints.
    triface checkedge;
    point e1, e2;
    REAL rrv, smrrv;

    // Get the shortest edge of this tet.
    checkedge.tet = chktet->tet;
    for (i = 0; i < 6; i++) {
      checkedge.ver = edge2ver[i];
      e1 = org(checkedge);
      e2 = dest(checkedge);
      elen[i] = distance(e1, e2);
      if (i == 0) {
        smlen = elen[i];
        j = 0;
      } else {
        if (elen[i] < smlen) {
          smlen = elen[i];
          j = i;
        }
      }
    }
    // Check if the edge is too short.
    checkedge.ver = edge2ver[j];
    // Get the smallest rrv of e1 and e2.
    // Note: if rrv of e1 and e2 is zero. Do not use it.
    e1 = org(checkedge);
    smrrv = getpointinsradius(e1);
    e2 = dest(checkedge);
    rrv = getpointinsradius(e2);
    if (rrv > 0) {
      if (smrrv > 0) {
        if (rrv < smrrv) {
          smrrv = rrv;
        }
      } else {
        smrrv = rrv;
      }
    }
    if (smrrv > 0) {
      // To avoid rounding error, round smrrv before doing comparison.
      if ((fabs(smrrv - smlen) / smlen) < b->epsilon) {
        smrrv = smlen;
      }
      if (smrrv > smlen) {
        return 0;
      }
    }
  } // if (useinsertradius)

  // Check the radius-edge ratio. Set by -q#.
  if (b->minratio > 0) { 
    // Calculate the circumcenter and radius of this tet.
    rhs[0] = 0.5 * dot(vda, vda);
    rhs[1] = 0.5 * dot(vdb, vdb);
    rhs[2] = 0.5 * dot(vdc, vdc);
    lu_solve(A, 3, indx, rhs, 0);            
    for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
    rd = sqrt(dot(rhs, rhs));
    if (!useinsertradius) {
      // Calculate the shortest edge length.
      elen[0] = dot(vda, vda);
      elen[1] = dot(vdb, vdb);
      elen[2] = dot(vdc, vdc);
      elen[3] = dot(vab, vab);
      elen[4] = dot(vbc, vbc);
      elen[5] = dot(vca, vca);
      smlen = elen[0]; //sidx = 0;
      for (i = 1; i < 6; i++) {
        if (smlen > elen[i]) { 
          smlen = elen[i]; //sidx = i; 
        }
      }
      smlen = sqrt(smlen);
    }
    D = rd / smlen;
    if (D > b->minratio) {
      // A bad radius-edge ratio.
      return 1;
    }
  }

  // Check the minimum dihedral angle. Set by -qq#.
  if (b->mindihedral > 0) { 
    // Compute the 4 face normals (N[0], ..., N[3]).
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) N[j][i] = 0.0;
      N[j][j] = 1.0;  // Positive means the inside direction
      lu_solve(A, 3, indx, N[j], 0);
    }
    for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      L[i] = sqrt(dot(N[i], N[i]));
      if (L[i] == 0) {
        terminatetetgen(this, 2);
      }
      for (j = 0; j < 3; j++) N[i][j] /= L[i];
    }
    // Calculate the six dihedral angles.
    cosd[0] = -dot(N[0], N[1]); // Edge cd, bd, bc.
    cosd[1] = -dot(N[0], N[2]);
    cosd[2] = -dot(N[0], N[3]);
    cosd[3] = -dot(N[1], N[2]); // Edge ad, ac
    cosd[4] = -dot(N[1], N[3]);
    cosd[5] = -dot(N[2], N[3]); // Edge ab
    // Get the smallest dihedral angle.
    //maxcosd = mincosd = cosd[0];
    maxcosd = cosd[0];
    for (i = 1; i < 6; i++) {
      //if (cosd[i] > maxcosd) maxcosd = cosd[i];
      maxcosd = (cosd[i] > maxcosd ? cosd[i] : maxcosd);
      //mincosd = (cosd[i] < mincosd ? cosd[i] : maxcosd);
    }
    if (maxcosd > cosmindihed) {
      // Calculate the circumcenter of this tet.
      // A bad dihedral angle.
      //if ((b->quality & 1) == 0) {
        rhs[0] = 0.5 * dot(vda, vda);
        rhs[1] = 0.5 * dot(vdb, vdb);
        rhs[2] = 0.5 * dot(vdc, vdc);
        lu_solve(A, 3, indx, rhs, 0);            
        for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
        //*rd = sqrt(dot(rhs, rhs));
      //}
      return 1;
    }
  }

  return 0;
}